

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_flushroot(jit_State *J,GCtrace *T)

{
  ulong uVar1;
  GCtrace *in_RSI;
  jit_State *in_RDI;
  GCtrace *T2;
  GCproto *pt;
  ulong local_20;
  
  uVar1 = (ulong)(in_RSI->startpt).gcptr32;
  trace_unpatch(in_RDI,in_RSI);
  if (*(TraceNo1 *)(uVar1 + 0x26) == in_RSI->traceno) {
    *(TraceNo1 *)(uVar1 + 0x26) = in_RSI->nextroot;
  }
  else if ((*(short *)(uVar1 + 0x26) != 0) &&
          (local_20 = (ulong)in_RDI->trace[*(ushort *)(uVar1 + 0x26)].gcptr32, local_20 != 0)) {
    for (; *(short *)(local_20 + 0x56) != 0;
        local_20 = (ulong)in_RDI->trace[*(ushort *)(local_20 + 0x56)].gcptr32) {
      if (*(TraceNo1 *)(local_20 + 0x56) == in_RSI->traceno) {
        *(TraceNo1 *)(local_20 + 0x56) = in_RSI->nextroot;
        return;
      }
    }
  }
  return;
}

Assistant:

static void trace_flushroot(jit_State *J, GCtrace *T)
{
  GCproto *pt = &gcref(T->startpt)->pt;
  lua_assert(T->root == 0 && pt != NULL);
  /* First unpatch any modified bytecode. */
  trace_unpatch(J, T);
  /* Unlink root trace from chain anchored in prototype. */
  if (pt->trace == T->traceno) {  /* Trace is first in chain. Easy. */
    pt->trace = T->nextroot;
  } else if (pt->trace) {  /* Otherwise search in chain of root traces. */
    GCtrace *T2 = traceref(J, pt->trace);
    if (T2) {
      for (; T2->nextroot; T2 = traceref(J, T2->nextroot))
	if (T2->nextroot == T->traceno) {
	  T2->nextroot = T->nextroot;  /* Unlink from chain. */
	  break;
	}
    }
  }
}